

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

map_index_t __thiscall
google::protobuf::internal::UntypedMapBase::VariantBucketNumber(UntypedMapBase *this,VariantKey key)

{
  map_index_t mVar1;
  string_view key_00;
  
  if (key.data != (char *)0x0) {
    key_00._M_str = key.data;
    key_00._M_len = key.integral;
    mVar1 = VariantBucketNumber(this,key_00);
    return mVar1;
  }
  mVar1 = VariantBucketNumber(this,key.integral);
  return mVar1;
}

Assistant:

map_index_t VariantBucketNumber(VariantKey key) const {
    return key.data == nullptr
               ? VariantBucketNumber(key.integral)
               : VariantBucketNumber(absl::string_view(
                     key.data, static_cast<size_t>(key.integral)));
  }